

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::EditSwapCharacter(Linenoise *this)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  Linenoise *in_RDI;
  int cur_char_size;
  int prev_char_size;
  int next_pos;
  int prev_pos;
  char temp_buffer [128];
  undefined1 local_88 [136];
  
  if ((in_RDI->pos != 0) && (1 < in_RDI->len)) {
    if (in_RDI->len < in_RDI->pos + 1) {
      sVar2 = PrevChar((Linenoise *)0x1f9b61);
      in_RDI->pos = sVar2;
    }
    sVar2 = PrevChar((Linenoise *)0x1f9b77);
    iVar1 = (int)sVar2;
    sVar2 = NextChar((Linenoise *)0x1f9b85);
    iVar3 = (int)in_RDI->pos - iVar1;
    iVar4 = (int)sVar2 - (int)in_RDI->pos;
    memcpy(local_88,in_RDI->buf + iVar1,(long)iVar3);
    memmove(in_RDI->buf + iVar1,in_RDI->buf + in_RDI->pos,(long)iVar4);
    memcpy(in_RDI->buf + (long)iVar4 + (long)iVar1,local_88,(long)iVar3);
    in_RDI->pos = (long)(int)sVar2;
    RefreshLine(in_RDI);
  }
  return;
}

Assistant:

void Linenoise::EditSwapCharacter() {
	if (pos == 0 || len < 2) {
		return;
	}
	char temp_buffer[128];
	if (pos + 1 > len) {
		pos = PrevChar();
	}
	int prev_pos = PrevChar();
	int next_pos = NextChar();
	int prev_char_size = pos - prev_pos;
	int cur_char_size = next_pos - pos;
	memcpy(temp_buffer, buf + prev_pos, prev_char_size);
	memmove(buf + prev_pos, buf + pos, cur_char_size);
	memcpy(buf + prev_pos + cur_char_size, temp_buffer, prev_char_size);
	pos = next_pos;
	RefreshLine();
}